

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

DnsNameEntry * __thiscall DnsNameEntry::CreateCopy(DnsNameEntry *this)

{
  size_t __n;
  DnsStatsLeakType DVar1;
  int iVar2;
  DnsNameEntry *this_00;
  uint8_t *__dest;
  size_t __n_00;
  
  this_00 = (DnsNameEntry *)operator_new(0x50);
  DnsNameEntry(this_00);
  __n_00 = this->name_len;
  this_00->name_len = __n_00;
  if (__n_00 != 0) {
    if (this_00->name != (uint8_t *)0x0) {
      operator_delete__(this_00->name);
      __n_00 = this->name_len;
    }
    __dest = (uint8_t *)operator_new__(__n_00 + 1);
    this_00->name = __dest;
    memcpy(__dest,this->name,__n_00);
    __dest[__n_00] = '\0';
    this_00->count = this->count;
    DVar1 = this->leakType;
    this_00->is_nx = this->is_nx;
    this_00->leakType = DVar1;
    __n = this->addr_len;
    memcpy(this_00->addr,this->addr,__n);
    this_00->addr_len = __n;
    iVar2 = this->flags;
    this_00->rr_type = this->rr_type;
    this_00->flags = iVar2;
  }
  return this_00;
}

Assistant:

DnsNameEntry* DnsNameEntry::CreateCopy()
{
    DnsNameEntry* key = new DnsNameEntry();

    if (key != NULL)
    {
        key->name_len = name_len;
        if (name_len > 0) {
            if (key->name != NULL) {
                delete[] key->name;
            }

            key->name = new uint8_t[(size_t)name_len + 1];

            if (key->name == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->name, name, name_len);
                key->name[name_len] = 0;
                key->count = count;
                key->is_nx = is_nx;
                key->leakType = leakType;
                memcpy(key->addr, addr, addr_len);
                key->addr_len = addr_len;
                key->rr_type = rr_type;
                key->flags = flags;
            }
        }
    }

    return key;
}